

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

int __thiscall
CVmObjDate::getp_getISOWeekDate(CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int32_t dayno;
  uint uVar2;
  uint uVar3;
  CVmTimeZone *tz;
  uint argc;
  undefined4 in_register_00000034;
  int iy;
  caldate_t cd;
  
  if (oargc == (uint *)0x0) {
    argc = 0;
  }
  else {
    argc = *oargc;
  }
  if (getp_getISOWeekDate(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar1 = __cxa_guard_acquire(&getp_getISOWeekDate(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar1 != 0) {
      getp_getISOWeekDate::desc.min_argc_ = 0;
      getp_getISOWeekDate::desc.opt_argc_ = 1;
      getp_getISOWeekDate::desc.varargs_ = 0;
      __cxa_guard_release(&getp_getISOWeekDate(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getISOWeekDate::desc);
  if (iVar1 == 0) {
    tz = get_tz_arg(0,argc);
    dayno = get_local_date(this,tz);
    caldate_t::set_dayno(&cd,dayno);
    uVar2 = caldate_t::iso_weekno(&cd,&iy);
    uVar3 = caldate_t::iso_weekday(&cd);
    make_int_list(retval,3,(ulong)(uint)iy,(ulong)uVar2,(ulong)uVar3);
    sp_ = sp_ + -(long)(int)argc;
  }
  return 1;
}

Assistant:

int CVmObjDate::getp_getISOWeekDate(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get my date in local time */
    int32_t dayno = get_local_date(get_tz_arg(vmg_ 0, argc));

    /* express it as a calendar date */
    caldate_t cd(dayno);

    /* return [iso year, iso week, iso day] */
    int iy;
    int iw = cd.iso_weekno(&iy);
    make_int_list(vmg_ retval, 3, iy, iw, cd.iso_weekday());

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}